

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QSize __thiscall QToolBarAreaLayoutLine::sizeHint(QToolBarAreaLayoutLine *this)

{
  int iVar1;
  bool bVar2;
  qsizetype qVar3;
  const_reference pQVar4;
  int *piVar5;
  Orientation *pOVar6;
  long in_RDI;
  long in_FS_OFFSET;
  QToolBarAreaLayoutItem *item;
  int i;
  int a;
  QSize sh;
  int b;
  QSize result;
  QSize *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  Orientation in_stack_ffffffffffffff94;
  QToolBarAreaLayoutItem *in_stack_ffffffffffffff98;
  int local_4c;
  int local_30;
  Orientation local_2c;
  int local_20;
  QSize local_1c;
  int local_14;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = 0;
  local_14 = 0;
  for (local_30 = 0;
      qVar3 = QList<QToolBarAreaLayoutItem>::size((QList<QToolBarAreaLayoutItem> *)(in_RDI + 0x18)),
      local_30 < qVar3; local_30 = local_30 + 1) {
    pQVar4 = QList<QToolBarAreaLayoutItem>::at
                       ((QList<QToolBarAreaLayoutItem> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        (qsizetype)in_stack_ffffffffffffff88);
    bVar2 = QToolBarAreaLayoutItem::skip(in_stack_ffffffffffffff98);
    if (!bVar2) {
      local_1c = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      local_1c = QToolBarAreaLayoutItem::sizeHint
                           ((QToolBarAreaLayoutItem *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (pQVar4->preferredSize < 1) {
        local_4c = pick(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
      }
      else {
        local_4c = pQVar4->preferredSize;
      }
      local_2c = local_4c + local_2c;
      local_20 = perp(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
      piVar5 = qMax<int>(&local_14,&local_20);
      local_14 = *piVar5;
    }
  }
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  pOVar6 = (Orientation *)rpick(local_2c,in_stack_ffffffffffffff88);
  iVar1 = local_14;
  *pOVar6 = local_2c;
  piVar5 = rperp(local_2c,in_stack_ffffffffffffff88);
  *piVar5 = iVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QToolBarAreaLayoutLine::sizeHint() const
{
    int a = 0, b = 0;
    for (int i = 0; i < toolBarItems.size(); ++i) {
        const QToolBarAreaLayoutItem &item = toolBarItems.at(i);
        if (item.skip())
            continue;

        QSize sh = item.sizeHint();
        a += item.preferredSize > 0 ? item.preferredSize : pick(o, sh);
        b = qMax(b, perp(o, sh));
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

    return result;
}